

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::unitBtran(HEkk *this,HighsInt iRow,HVector *row_ep)

{
  reference pvVar1;
  reference pvVar2;
  long in_RDX;
  value_type in_ESI;
  HEkk *in_RDI;
  double dVar3;
  double local_row_ep_density;
  HighsInt num_row;
  undefined4 in_stack_ffffffffffffffc8;
  HVector *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  undefined4 in_stack_fffffffffffffff0;
  value_type vVar5;
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffd8);
  HVectorBase<double>::clear((HVectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined4 *)(in_RDX + 4) = 1;
  vVar5 = in_ESI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),0);
  *pvVar1 = in_ESI;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)vVar5);
  *pvVar2 = 1.0;
  *(undefined1 *)(in_RDX + 0x78) = 1;
  if (((in_RDI->analysis_).analyse_simplex_summary_data & 1U) != 0) {
    HighsSimplexAnalysis::operationRecordBefore
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
               ,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(HVector *)in_RDI,
               (double)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
  }
  HSimplexNla::btran((HSimplexNla *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,(double)in_RDI,
                     (HighsTimerClock *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
  if (((in_RDI->analysis_).analyse_simplex_summary_data & 1U) != 0) {
    HighsSimplexAnalysis::operationRecordAfter
              ((HighsSimplexAnalysis *)in_RDI,in_ESI,(HVector *)0x7728d9);
  }
  iVar4 = (in_RDI->lp_).num_row_;
  dVar3 = (double)*(int *)(in_RDX + 4) / (double)iVar4;
  updateOperationResultDensity(in_RDI,dVar3,&(in_RDI->info_).row_ep_density);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
             (HighsInt)((ulong)dVar3 >> 0x20),SUB84(dVar3,0));
  return;
}

Assistant:

void HEkk::unitBtran(const HighsInt iRow, HVector& row_ep) {
  analysis_.simplexTimerStart(BtranClock);
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = iRow;
  row_ep.array[iRow] = 1;
  row_ep.packFlag = true;
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordBefore(kSimplexNlaBtranEp, row_ep,
                                    info_.row_ep_density);
  simplex_nla_.btran(row_ep, info_.row_ep_density,
                     analysis_.pointer_serial_factor_clocks);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordAfter(kSimplexNlaBtranEp, row_ep);
  HighsInt num_row = lp_.num_row_;
  const double local_row_ep_density = (double)row_ep.count / num_row;
  updateOperationResultDensity(local_row_ep_density, info_.row_ep_density);
  analysis_.simplexTimerStop(BtranClock);
}